

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O3

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,char *filename)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char cVar3;
  impl *piVar4;
  undefined4 *puVar5;
  char *pcVar6;
  undefined4 uVar7;
  streampos sVar8;
  FourCC read_id;
  shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> stream;
  FourCC local_44;
  basic_ifstream<char,_std::char_traits<char>_> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  char *local_30;
  
  local_30 = filename;
  piVar4 = (impl *)operator_new(0x48);
  (piVar4->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (piVar4->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar4->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar4->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar4->m_pos)._M_off = 0;
  (piVar4->m_pos)._M_state.__count = 0;
  (piVar4->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar4->m_limit)._M_off = 0;
  (piVar4->m_limit)._M_state.__count = 0;
  (piVar4->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  piVar4->m_id = (_Type)0x0;
  piVar4->m_size = 0;
  this->pimpl = piVar4;
  local_40 = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::ifstream,std::allocator<std::ifstream>,char_const*&,std::_Ios_Openmode_const&>
            (&local_38,&local_40,
             (allocator<std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_44,&local_30,
             (_Ios_Openmode *)&std::ios_base::binary);
  pbVar1 = local_40;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    pcVar6 = "Couldn\'t open specified file";
    uVar7 = 1;
  }
  else {
    piVar4 = this->pimpl;
    (piVar4->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)pbVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(piVar4->m_stream).
                super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_38);
    sVar8 = (streampos)std::istream::tellg();
    this->pimpl->m_pos = sVar8;
    std::istream::seekg((long)(this->pimpl->m_stream).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
    sVar8 = (streampos)std::istream::tellg();
    _Var2._M_pi = local_38._M_pi;
    pbVar1 = local_40;
    this->pimpl->m_limit = sVar8;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      }
    }
    std::istream::seekg(local_40,(this->pimpl->m_pos)._M_off,(this->pimpl->m_pos)._M_state);
    std::istream::read((char *)pbVar1,(long)&local_44);
    *&(this->pimpl->m_id)._M_elems = local_44._M_elems;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    _Var2._M_pi = local_38._M_pi;
    pbVar1 = local_40;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      }
    }
    std::istream::seekg(local_40,(this->pimpl->m_pos)._M_off + 4,(this->pimpl->m_pos)._M_state);
    std::istream::read((char *)pbVar1,(long)&local_44);
    piVar4 = this->pimpl;
    piVar4->m_size = (uint32_t)local_44._M_elems;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      piVar4 = this->pimpl;
      local_44._M_elems = (_Type)piVar4->m_size;
    }
    if ((long)((ulong)(uint)local_44._M_elems + (piVar4->m_pos)._M_off) <= (piVar4->m_limit)._M_off)
    {
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      return;
    }
    pcVar6 = "Chunk size outside of range";
    uVar7 = 2;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(0x10);
  *puVar5 = uVar7;
  *(char **)(puVar5 + 2) = pcVar6;
  __cxa_throw(puVar5,&Error::typeinfo,0);
}

Assistant:

riffcpp::Chunk::Chunk(const char *filename) {
  pimpl = new riffcpp::Chunk::impl();
  auto stream = std::make_shared<std::ifstream>(filename, std::ios::binary);

  if (!stream->is_open()) {
    throw Error("Couldn't open specified file", ErrorType::CannotOpenFile);
  }

  pimpl->m_stream = stream;
  pimpl->m_pos = pimpl->m_stream->tellg();

  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(stream, pimpl->m_pos);
  pimpl->m_size = read_size(stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}